

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SnippetAdvance(char **ppIter,int *piIter,int iNext)

{
  int in_EDX;
  int *in_RSI;
  long *in_RDI;
  int iIter;
  char *pIter;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  char **pp;
  
  pp = (char **)*in_RDI;
  if (pp != (char **)0x0) {
    iVar1 = *in_RSI;
    while (iVar1 < in_EDX) {
      if (((int)*(char *)pp & 0xfeU) == 0) {
        iVar1 = -1;
        pp = (char **)0x0;
        break;
      }
      fts3GetDeltaPosition(pp,(int *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
    *in_RSI = iVar1;
    *in_RDI = (long)pp;
  }
  return;
}

Assistant:

static void fts3SnippetAdvance(char **ppIter, int *piIter, int iNext){
  char *pIter = *ppIter;
  if( pIter ){
    int iIter = *piIter;

    while( iIter<iNext ){
      if( 0==(*pIter & 0xFE) ){
        iIter = -1;
        pIter = 0;
        break;
      }
      fts3GetDeltaPosition(&pIter, &iIter);
    }

    *piIter = iIter;
    *ppIter = pIter;
  }
}